

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Functors.h
# Opt level: O0

void __thiscall
Eigen::internal::linspaced_op_impl<int,_false>::linspaced_op_impl
          (linspaced_op_impl<int,_false> *this,int *low,int *step)

{
  longlong extraout_XMM0_Qa;
  longlong extraout_XMM0_Qa_00;
  longlong extraout_XMM0_Qb;
  longlong extraout_XMM0_Qb_00;
  int local_6c;
  longlong local_68 [2];
  longlong local_58 [2];
  longlong local_48 [2];
  longlong local_38 [2];
  int local_24;
  int *local_20;
  int *step_local;
  int *low_local;
  linspaced_op_impl<int,_false> *this_local;
  
  this->m_low = *low;
  this->m_step = *step;
  local_24 = *step << 2;
  local_20 = step;
  step_local = low;
  low_local = &this->m_low;
  pset1<long_long__vector(2)>(&local_24);
  this->m_packetStep[0] = extraout_XMM0_Qa;
  this->m_packetStep[1] = extraout_XMM0_Qb;
  pset1<long_long__vector(2)>(step_local);
  pset1<long_long__vector(2)>(local_20);
  local_6c = -4;
  plset<int>(&local_6c);
  pmul<long_long__vector(2)>(&local_58,&local_68);
  padd<long_long__vector(2)>(&local_38,&local_48);
  this->m_base[0] = extraout_XMM0_Qa_00;
  this->m_base[1] = extraout_XMM0_Qb_00;
  return;
}

Assistant:

linspaced_op_impl(const Scalar& low, const Scalar& step) :
  m_low(low), m_step(step),
  m_packetStep(pset1<Packet>(packet_traits<Scalar>::size*step)),
  m_base(padd(pset1<Packet>(low), pmul(pset1<Packet>(step),plset<Scalar>(-packet_traits<Scalar>::size)))) {}